

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O0

bool __thiscall
ruckig::Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
          (Profile *this,double jf,double vMax,double vMin,double aMax,double aMin)

{
  value_type vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  reference pvVar7;
  reference pvVar8;
  array<double,_8UL> *paVar9;
  double dVar10;
  double dVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  bool local_1d1;
  double local_1d0;
  double local_1c8;
  double local_120;
  double local_118;
  double local_110;
  double local_100;
  double local_f0;
  double local_e0;
  double aLowLim;
  double aUppLim;
  double v_a_zero;
  size_t i_1;
  double vLowLim;
  double vUppLim;
  undefined8 local_78;
  double local_70;
  undefined8 local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  ulong local_48;
  size_t i;
  double aMin_local;
  double aMax_local;
  double vMin_local;
  double vMax_local;
  double jf_local;
  Profile *this_local;
  
  i = (size_t)aMin;
  aMin_local = aMax;
  aMax_local = vMin;
  vMin_local = vMax;
  vMax_local = jf;
  jf_local = (double)this;
  pvVar7 = std::array<double,_7UL>::operator[](&this->t,0);
  if (0.0 < *pvVar7 || *pvVar7 == 0.0) {
    pvVar7 = std::array<double,_7UL>::operator[](&this->t,0);
    vVar1 = *pvVar7;
    pvVar7 = std::array<double,_7UL>::operator[](&this->t_sum,0);
    *pvVar7 = vVar1;
    for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,local_48 + 1);
      if (*pvVar7 <= 0.0 && *pvVar7 != 0.0) {
        return false;
      }
      pvVar7 = std::array<double,_7UL>::operator[](&this->t_sum,local_48);
      dVar11 = *pvVar7;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,local_48 + 1);
      dVar2 = *pvVar7;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t_sum,local_48 + 1);
      *pvVar7 = dVar11 + dVar2;
    }
    pvVar7 = std::array<double,_7UL>::back(&this->t_sum);
    if (*pvVar7 <= 1000000000000.0) {
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,0);
      if (*pvVar7 <= 0.0) {
        local_e0 = 0.0;
      }
      else {
        local_e0 = vMax_local;
      }
      vUppLim = local_e0;
      local_78 = 0;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,2);
      if (*pvVar7 <= 0.0) {
        local_f0 = 0.0;
      }
      else {
        local_f0 = -vMax_local;
      }
      local_70 = local_f0;
      local_68 = 0;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,4);
      if (*pvVar7 <= 0.0) {
        local_100 = 0.0;
      }
      else {
        local_100 = -vMax_local;
      }
      local_60 = local_100;
      local_58 = 0;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,6);
      if (*pvVar7 <= 0.0) {
        local_110 = 0.0;
      }
      else {
        local_110 = vMax_local;
      }
      local_50 = local_110;
      memcpy(&this->j,&vUppLim,0x38);
      this->direction = (uint)(vMin_local <= 0.0);
      if (this->direction == UP) {
        local_118 = vMin_local;
      }
      else {
        local_118 = aMax_local;
      }
      local_118 = local_118 + 1e-12;
      if (this->direction == UP) {
        local_120 = aMax_local;
      }
      else {
        local_120 = vMin_local;
      }
      local_120 = local_120 - 1e-12;
      for (v_a_zero = 0.0; (ulong)v_a_zero < 7; v_a_zero = (double)((long)v_a_zero + 1)) {
        pvVar8 = std::array<double,_8UL>::operator[](&this->a,(size_type)v_a_zero);
        dVar11 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,(size_type)v_a_zero);
        dVar2 = *pvVar7;
        pvVar7 = std::array<double,_7UL>::operator[](&this->j,(size_type)v_a_zero);
        dVar10 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->a,(long)v_a_zero + 1);
        *pvVar8 = dVar2 * dVar10 + dVar11;
        pvVar8 = std::array<double,_8UL>::operator[](&this->v,(size_type)v_a_zero);
        dVar11 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,(size_type)v_a_zero);
        dVar2 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->a,(size_type)v_a_zero);
        dVar10 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,(size_type)v_a_zero);
        dVar3 = *pvVar7;
        pvVar7 = std::array<double,_7UL>::operator[](&this->j,(size_type)v_a_zero);
        dVar4 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->v,(long)v_a_zero + 1);
        *pvVar8 = dVar2 * (dVar10 + (dVar3 * dVar4) / 2.0) + dVar11;
        pvVar8 = std::array<double,_8UL>::operator[](&this->p,(size_type)v_a_zero);
        dVar11 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,(size_type)v_a_zero);
        dVar2 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->v,(size_type)v_a_zero);
        dVar10 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,(size_type)v_a_zero);
        dVar3 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->a,(size_type)v_a_zero);
        dVar4 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,(size_type)v_a_zero);
        dVar5 = *pvVar7;
        pvVar7 = std::array<double,_7UL>::operator[](&this->j,(size_type)v_a_zero);
        dVar6 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->p,(long)v_a_zero + 1);
        *pvVar8 = dVar2 * (dVar3 * (dVar4 / 2.0 + (dVar5 * dVar6) / 6.0) + dVar10) + dVar11;
        if (1 < (ulong)v_a_zero) {
          pvVar8 = std::array<double,_8UL>::operator[](&this->a,(long)v_a_zero + 1);
          dVar11 = *pvVar8;
          pvVar8 = std::array<double,_8UL>::operator[](&this->a,(size_type)v_a_zero);
          dVar2 = *pvVar8;
          dVar10 = std::numeric_limits<double>::epsilon();
          if (dVar11 * dVar2 < -dVar10) {
            pvVar8 = std::array<double,_8UL>::operator[](&this->v,(size_type)v_a_zero);
            dVar11 = *pvVar8;
            pvVar8 = std::array<double,_8UL>::operator[](&this->a,(size_type)v_a_zero);
            dVar2 = *pvVar8;
            pvVar8 = std::array<double,_8UL>::operator[](&this->a,(size_type)v_a_zero);
            dVar10 = *pvVar8;
            pvVar7 = std::array<double,_7UL>::operator[](&this->j,(size_type)v_a_zero);
            dVar11 = dVar11 - (dVar2 * dVar10) / (*pvVar7 * 2.0);
            if ((local_118 < dVar11) || (dVar11 < local_120)) {
              return false;
            }
          }
        }
      }
      this->control_signs = UDDU;
      this->limits = NONE;
      if (this->direction == UP) {
        local_1c8 = aMin_local;
      }
      else {
        local_1c8 = (double)i;
      }
      local_1c8 = local_1c8 + 1e-12;
      if (this->direction == UP) {
        local_1d0 = (double)i;
      }
      else {
        local_1d0 = aMin_local;
      }
      local_1d0 = local_1d0 - 1e-12;
      paVar9 = &this->p;
      std::array<double,_8UL>::back(paVar9);
      std::abs((int)paVar9);
      local_1d1 = false;
      if (extraout_XMM0_Qa < 1e-08) {
        paVar9 = &this->v;
        std::array<double,_8UL>::back(paVar9);
        std::abs((int)paVar9);
        local_1d1 = false;
        if (extraout_XMM0_Qa_00 < 1e-08) {
          paVar9 = &this->a;
          std::array<double,_8UL>::back(paVar9);
          std::abs((int)paVar9);
          local_1d1 = false;
          if (extraout_XMM0_Qa_01 < 1e-10) {
            pvVar8 = std::array<double,_8UL>::operator[](&this->a,1);
            local_1d1 = false;
            if (local_1d0 <= *pvVar8) {
              pvVar8 = std::array<double,_8UL>::operator[](&this->a,3);
              local_1d1 = false;
              if (local_1d0 <= *pvVar8) {
                pvVar8 = std::array<double,_8UL>::operator[](&this->a,5);
                local_1d1 = false;
                if (local_1d0 <= *pvVar8) {
                  pvVar8 = std::array<double,_8UL>::operator[](&this->a,1);
                  local_1d1 = false;
                  if (*pvVar8 <= local_1c8) {
                    pvVar8 = std::array<double,_8UL>::operator[](&this->a,3);
                    local_1d1 = false;
                    if (*pvVar8 <= local_1c8) {
                      pvVar8 = std::array<double,_8UL>::operator[](&this->a,5);
                      local_1d1 = false;
                      if (*pvVar8 <= local_1c8) {
                        pvVar8 = std::array<double,_8UL>::operator[](&this->v,3);
                        local_1d1 = false;
                        if (*pvVar8 <= local_118) {
                          pvVar8 = std::array<double,_8UL>::operator[](&this->v,4);
                          local_1d1 = false;
                          if (*pvVar8 <= local_118) {
                            pvVar8 = std::array<double,_8UL>::operator[](&this->v,5);
                            local_1d1 = false;
                            if (*pvVar8 <= local_118) {
                              pvVar8 = std::array<double,_8UL>::operator[](&this->v,6);
                              local_1d1 = false;
                              if (*pvVar8 <= local_118) {
                                pvVar8 = std::array<double,_8UL>::operator[](&this->v,3);
                                local_1d1 = false;
                                if (local_120 <= *pvVar8) {
                                  pvVar8 = std::array<double,_8UL>::operator[](&this->v,4);
                                  local_1d1 = false;
                                  if (local_120 <= *pvVar8) {
                                    pvVar8 = std::array<double,_8UL>::operator[](&this->v,5);
                                    local_1d1 = false;
                                    if (local_120 <= *pvVar8) {
                                      pvVar8 = std::array<double,_8UL>::operator[](&this->v,6);
                                      local_1d1 = local_120 <= *pvVar8;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      this_local._7_1_ = local_1d1;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool check(double jf, double vMax, double vMin, double aMax, double aMin) {
        if (t[0] < 0) {
            return false;
        }

        t_sum[0] = t[0];
        for (size_t i = 0; i < 6; ++i) {
            if (t[i+1] < 0) {
                return false;
            }

            t_sum[i+1] = t_sum[i] + t[i+1];
        }

        if constexpr (limits == ReachedLimits::ACC0_ACC1_VEL || limits == ReachedLimits::ACC0_VEL || limits == ReachedLimits::ACC1_VEL || limits == ReachedLimits::VEL) {
            if (t[3] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if constexpr (limits == ReachedLimits::ACC0 || limits == ReachedLimits::ACC0_ACC1) {
            if (t[1] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if constexpr (limits == ReachedLimits::ACC1 || limits == ReachedLimits::ACC0_ACC1) {
            if (t[5] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        if constexpr (control_signs == ControlSigns::UDDU) {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? -jf : 0), 0, (t[6] > 0 ? jf : 0)};
        } else {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? jf : 0), 0, (t[6] > 0 ? -jf : 0)};
        }

        direction = (vMax > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;
        const double vUppLim = (direction == Profile::Direction::UP ? vMax : vMin) + v_eps;
        const double vLowLim = (direction == Profile::Direction::UP ? vMin : vMax) - v_eps;

        for (size_t i = 0; i < 7; ++i) {
            a[i+1] = a[i] + t[i] * j[i];
            v[i+1] = v[i] + t[i] * (a[i] + t[i] * j[i] / 2);
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * (a[i] / 2 + t[i] * j[i] / 6));

            if constexpr (limits == ReachedLimits::ACC0_ACC1_VEL || limits == ReachedLimits::ACC0_ACC1 || limits == ReachedLimits::ACC0_VEL || limits == ReachedLimits::ACC1_VEL || limits == ReachedLimits::VEL) {
                if (i == 2) {
                    a[3] = 0.0;
                }
            }

            if constexpr (set_limits) {
                if constexpr (limits == ReachedLimits::ACC1) {
                    if (i == 2) {
                        a[3] = aMin;
                    }
                }

                if constexpr (limits == ReachedLimits::ACC0_ACC1) {
                    if (i == 0) {
                        a[1] = aMax;
                    }

                    if (i == 4) {
                        a[5] = aMin;
                    }
                }
            }

            if (i > 1 && a[i+1] * a[i] < -std::numeric_limits<double>::epsilon()) {
                const double v_a_zero = v[i] - (a[i] * a[i]) / (2 * j[i]);
                if (v_a_zero > vUppLim || v_a_zero < vLowLim) {
                    return false;
                }
            }
        }

        this->control_signs = control_signs;
        this->limits = limits;

        const double aUppLim = (direction == Profile::Direction::UP ? aMax : aMin) + a_eps;
        const double aLowLim = (direction == Profile::Direction::UP ? aMin : aMax) - a_eps;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(16) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(p.back() - pf) < p_precision && std::abs(v.back() - vf) < v_precision && std::abs(a.back() - af) < a_precision
            && a[1] >= aLowLim && a[3] >= aLowLim && a[5] >= aLowLim
            && a[1] <= aUppLim && a[3] <= aUppLim && a[5] <= aUppLim
            && v[3] <= vUppLim && v[4] <= vUppLim && v[5] <= vUppLim && v[6] <= vUppLim
            && v[3] >= vLowLim && v[4] >= vLowLim && v[5] >= vLowLim && v[6] >= vLowLim;
    }